

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
absl::StrSplit<std::__cxx11::string>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,absl *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text,char delim,
          function<bool_(absl::string_view)> *predicate)

{
  char cVar1;
  long lVar2;
  undefined7 in_register_00000009;
  long lVar3;
  size_type sVar4;
  long lVar5;
  string_view view;
  string_view local_50;
  char *local_40;
  size_type local_38;
  
  lVar3 = CONCAT71(in_register_00000009,delim);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar5 = 0;
  lVar2 = std::__cxx11::string::find((char)this,(ulong)text & 0xffffffff);
  if (lVar2 != -1) {
    lVar5 = 0;
    do {
      local_50.ptr_ = (char *)(*(long *)this + lVar5);
      sVar4 = lVar2 - lVar5;
      if ((long)sVar4 < 0) {
        StrSplit<std::__cxx11::string>();
        goto LAB_00235289;
      }
      local_50.length_ = sVar4;
      local_40 = local_50.ptr_;
      local_38 = sVar4;
      if (*(long *)(lVar3 + 0x10) == 0) goto LAB_0023528e;
      cVar1 = (**(code **)(lVar3 + 0x18))(lVar3,&local_40);
      if (cVar1 != '\0') {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<absl::string_view&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_50);
      }
      lVar5 = lVar2 + 1;
      lVar2 = std::__cxx11::string::find((char)this,(ulong)(uint)(int)(char)text);
    } while (lVar2 != -1);
  }
  local_50.ptr_ = (char *)(*(long *)this + lVar5);
  sVar4 = *(long *)(this + 8) - lVar5;
  if (-1 < (long)sVar4) {
    local_50.length_ = sVar4;
    local_40 = local_50.ptr_;
    local_38 = sVar4;
    if (*(long *)(lVar3 + 0x10) != 0) {
      cVar1 = (**(code **)(lVar3 + 0x18))(lVar3,&local_40);
      if (cVar1 != '\0') {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<absl::string_view&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_50);
      }
      return __return_storage_ptr__;
    }
    std::__throw_bad_function_call();
  }
LAB_00235289:
  StrSplit<std::__cxx11::string>();
LAB_0023528e:
  std::__throw_bad_function_call();
}

Assistant:

vector<String> StrSplit(String const& text, char const delim,
                        function<bool(string_view)> predicate) {
  vector<String> elems;
  typename String::size_type begin = 0;
  typename String::size_type end;
  while ((end = text.find(delim, begin)) != String::npos) {
    string_view view(text.data() + begin, end - begin);
    if (predicate(view))
      elems.emplace_back(view);
    begin = end + 1;
  }
  // Try to add the portion after the last delim.
  string_view view(text.data() + begin, text.size() - begin);
  if (predicate(view))
    elems.emplace_back(view);
  return elems;
}